

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmon.cpp
# Opt level: O1

void __thiscall
netmon::read_raw_network_stats_test
          (netmon *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
          *stats,string *read_path)

{
  int iVar1;
  pointer ppVar2;
  pointer pcVar3;
  pointer pbVar4;
  mapped_type *pmVar5;
  pointer ppVar6;
  pointer __k;
  bool bVar7;
  unsigned_long_long value_read;
  string net_fname;
  ifstream net_stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string *local_2a0;
  undefined1 local_298 [32];
  _Alloc_hider local_278;
  char local_268 [16];
  _Alloc_hider local_258;
  char local_248 [16];
  monitored_value local_238 [3];
  
  iVar1 = read_raw_network_stats_test::iteration + 1;
  bVar7 = read_raw_network_stats_test::iteration == 0;
  read_raw_network_stats_test::iteration = iVar1;
  local_2a0 = read_path;
  if (bVar7) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
    ::clear(&(this->net_stats)._M_t);
    ppVar6 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar6 != ppVar2) {
      do {
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        pcVar3 = (ppVar6->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,pcVar3,pcVar3 + (ppVar6->m_name)._M_string_length);
        local_298._0_8_ = local_298 + 0x10;
        pcVar3 = (ppVar6->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar3,pcVar3 + (ppVar6->m_name)._M_string_length);
        local_278._M_p = local_268;
        pcVar3 = (ppVar6->m_max_unit)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,pcVar3,pcVar3 + (ppVar6->m_max_unit)._M_string_length);
        local_258._M_p = local_248;
        pcVar3 = (ppVar6->m_avg_unit)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,pcVar3,pcVar3 + (ppVar6->m_avg_unit)._M_string_length);
        prmon::monitored_value::monitored_value(local_238,(parameter *)local_298,true,0);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
        ::_M_emplace_unique<std::__cxx11::string_const,prmon::monitored_value>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
                    *)&this->net_stats,&local_2c0,local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0].m_param.m_avg_unit._M_dataplus._M_p !=
            &local_238[0].m_param.m_avg_unit.field_2) {
          operator_delete(local_238[0].m_param.m_avg_unit._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0].m_param.m_max_unit._M_dataplus._M_p !=
            &local_238[0].m_param.m_max_unit.field_2) {
          operator_delete(local_238[0].m_param.m_max_unit._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0].m_param.m_name._M_dataplus._M_p != &local_238[0].m_param.m_name.field_2)
        {
          operator_delete(local_238[0].m_param.m_name._M_dataplus._M_p);
        }
        if (local_258._M_p != local_248) {
          operator_delete(local_258._M_p);
        }
        if (local_278._M_p != local_268) {
          operator_delete(local_278._M_p);
        }
        if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
          operator_delete((void *)local_298._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar2);
    }
  }
  __k = (this->interface_params).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->interface_params).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pbVar4) {
    do {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
               ::operator[](stats,__k);
      *pmVar5 = 0;
      std::operator+(&local_2c0,local_2a0,__k);
      std::ifstream::ifstream(local_238,(string *)&local_2c0,_S_in);
      std::istream::_M_extract<unsigned_long_long>((ulonglong *)local_238);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
               ::operator[](stats,__k);
      *pmVar5 = *pmVar5;
      std::ifstream::~ifstream(local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      __k = __k + 1;
    } while (__k != pbVar4);
  }
  return;
}

Assistant:

void netmon::read_raw_network_stats_test(
    std::map<std::string, unsigned long long>& stats,
    const std::string& read_path) {
  static int iteration = 0;
  ++iteration;
  if (iteration == 1) {
    // Reset all net_stats initialised in constructor to 0 for testing
    net_stats.clear();
    for (const auto& param : params) {
      net_stats.emplace(param.get_name(),
                        prmon::monitored_value(param, true, 0));
    }
  }
  for (const auto& if_param : interface_params) {
    unsigned long long value_read{};
    stats[if_param] = 0;
    std::string net_fname = read_path + if_param;
    std::ifstream net_stream(net_fname);
    net_stream >> value_read;
    stats[if_param] += value_read;
  }
}